

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpRenewSubscription(UpnpClient_Handle Hnd,int *TimeOut,char *SubsId)

{
  Upnp_Handle_Type UVar1;
  UpnpString *p;
  UpnpString *SubsIdTmp;
  Handle_Info *pHStack_28;
  int retVal;
  Handle_Info *SInfo;
  char *SubsId_local;
  int *TimeOut_local;
  UpnpClient_Handle Hnd_local;
  
  pHStack_28 = (Handle_Info *)0x0;
  SInfo = (Handle_Info *)SubsId;
  SubsId_local = (char *)TimeOut;
  TimeOut_local._4_4_ = Hnd;
  p = UpnpString_new();
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x9ad,"Inside UpnpRenewSubscription\n");
  if (UpnpSdkInit == 1) {
    if (p == (UpnpString *)0x0) {
      SubsIdTmp._4_4_ = 0xffffff98;
    }
    else if (SInfo == (Handle_Info *)0x0) {
      SubsIdTmp._4_4_ = 0xffffff9b;
    }
    else {
      UpnpString_set_String(p,(char *)SInfo);
      if (SubsId_local == (char *)0x0) {
        SubsIdTmp._4_4_ = 0xffffff9b;
      }
      else {
        HandleReadLock(".upnp/src/api/upnpapi.c",0x9c4);
        UVar1 = GetHandleInfo(TimeOut_local._4_4_,&stack0xffffffffffffffd8);
        if (UVar1 == HND_CLIENT) {
          HandleUnlock(".upnp/src/api/upnpapi.c",0x9cd);
          SubsIdTmp._4_4_ = genaRenewSubscription(TimeOut_local._4_4_,p,(int *)SubsId_local);
        }
        else {
          HandleUnlock(".upnp/src/api/upnpapi.c",0x9c9);
          SubsIdTmp._4_4_ = 0xffffff9c;
        }
      }
    }
  }
  else {
    SubsIdTmp._4_4_ = 0xffffff8c;
  }
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x9d5,
             "Exiting UpnpRenewSubscription, retVal=%d\n",(ulong)SubsIdTmp._4_4_);
  UpnpString_delete(p);
  return SubsIdTmp._4_4_;
}

Assistant:

int UpnpRenewSubscription(
	UpnpClient_Handle Hnd, int *TimeOut, const Upnp_SID SubsId)
{
	struct Handle_Info *SInfo = NULL;
	int retVal;
	UpnpString *SubsIdTmp = UpnpString_new();

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpRenewSubscription\n");

	if (UpnpSdkInit != 1) {
		retVal = UPNP_E_FINISH;
		goto exit_function;
	}

	if (SubsIdTmp == NULL) {
		retVal = UPNP_E_OUTOF_MEMORY;
		goto exit_function;
	}
	if (SubsId == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	UpnpString_set_String(SubsIdTmp, SubsId);

	if (TimeOut == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		retVal = UPNP_E_INVALID_HANDLE;
		goto exit_function;
	}
	HandleUnlock(__FILE__, __LINE__);

	retVal = genaRenewSubscription(Hnd, SubsIdTmp, TimeOut);

exit_function:
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpRenewSubscription, retVal=%d\n",
		retVal);

	UpnpString_delete(SubsIdTmp);

	return retVal;
}